

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O0

void __thiscall
Diligent::QueryBase<Diligent::EngineGLImplTraits>::OnBeginQuery
          (QueryBase<Diligent::EngineGLImplTraits> *this,DeviceContextImplType *pContext)

{
  Char *pCVar1;
  DeviceContextGLImpl *pDVar2;
  char (*in_R8) [61];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  DeviceContextImplType *pContext_local;
  QueryBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = pContext;
  if ((this->
      super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>)
      .m_Desc.Type == QUERY_TYPE_TIMESTAMP) {
    FormatString<char[49],char_const*,char[39]>
              ((string *)local_38,(Diligent *)"BeginQuery cannot be called on timestamp query \'",
               (char (*) [49])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\'. Call EndQuery to set the timestamp.",(char (*) [39])in_R8);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"OnBeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x83);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_State == Querying) {
    FormatString<char[28],char_const*,char[61]>
              ((string *)local_68,(Diligent *)"Attempting to begin query \'",
               (char (*) [28])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' twice. A query must be ended before it can be begun again.",
               in_R8);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"OnBeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x87);
    std::__cxx11::string::~string((string *)local_68);
  }
  pDVar2 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextGLImpl_
                     ((RefCntAutoPtr *)&this->m_pContext);
  if (pDVar2 != (DeviceContextGLImpl *)0x0) {
    pDVar2 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextGLImpl_
                       ((RefCntAutoPtr *)&this->m_pContext);
    if (pDVar2 != (DeviceContextGLImpl *)msg.field_2._8_8_) {
      (**(code **)((long)(this->
                         super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                         ).super_ObjectBase<Diligent::IQueryGL>.
                         super_RefCountedObject<Diligent::IQueryGL>.super_IQueryGL.super_IQuery.
                         super_IDeviceObject.super_IObject + 0x48))();
    }
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator=
            (&this->m_pContext,(DeviceContextGLImpl *)msg.field_2._8_8_);
  this->m_State = Querying;
  return;
}

Assistant:

void OnBeginQuery(DeviceContextImplType* pContext)
    {
        DEV_CHECK_ERR(this->m_Desc.Type != QUERY_TYPE_TIMESTAMP,
                      "BeginQuery cannot be called on timestamp query '", this->m_Desc.Name,
                      "'. Call EndQuery to set the timestamp.");

        DEV_CHECK_ERR(m_State != QueryState::Querying,
                      "Attempting to begin query '", this->m_Desc.Name,
                      "' twice. A query must be ended before it can be begun again.");

        if (m_pContext != nullptr && m_pContext != pContext)
            Invalidate();

        m_pContext = pContext;
        m_State    = QueryState::Querying;
    }